

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O3

void tcmalloc::DeleteSpan(Span *span)

{
  span->start = Static::span_allocator_._16_8_;
  Static::span_allocator_._16_8_ = span;
  Static::span_allocator_._24_4_ = Static::span_allocator_._24_4_ + -1;
  return;
}

Assistant:

void Delete(T* p) {
#ifndef NDEBUG
    memset(static_cast<void*>(p), 0xAA, sizeof(T));
#endif
    *(reinterpret_cast<void**>(p)) = free_list_;
    free_list_ = p;
    inuse_--;
  }